

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O2

void __thiscall tinyxml2::StrPair::TransferTo(StrPair *this,StrPair *other)

{
  char *pcVar1;
  
  if (this != other) {
    Reset(other);
    other->_flags = this->_flags;
    pcVar1 = this->_end;
    other->_start = this->_start;
    other->_end = pcVar1;
    this->_flags = 0;
    this->_start = (char *)0x0;
    this->_end = (char *)0x0;
  }
  return;
}

Assistant:

void StrPair::TransferTo( StrPair* other )
{
    if ( this == other ) {
        return;
    }
    // This in effect implements the assignment operator by "moving"
    // ownership (as in auto_ptr).

    TIXMLASSERT( other != 0 );
    TIXMLASSERT( other->_flags == 0 );
    TIXMLASSERT( other->_start == 0 );
    TIXMLASSERT( other->_end == 0 );

    other->Reset();

    other->_flags = _flags;
    other->_start = _start;
    other->_end = _end;

    _flags = 0;
    _start = 0;
    _end = 0;
}